

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

void __thiscall
QTableModel::ensureSorted(QTableModel *this,int column,SortOrder order,int start,int end)

{
  QTableWidgetItem **ppQVar1;
  int *piVar2;
  int iVar3;
  parameter_type item;
  QTableWidgetItem *pQVar4;
  long lVar5;
  bool bVar6;
  Data *pDVar7;
  size_type_conflict1 sVar8;
  QTableWidgetItem **ppQVar9;
  int iVar10;
  iterator __seed;
  iterator __last;
  long lVar11;
  iterator iVar12;
  iterator iVar13;
  iterator iVar14;
  pointer ppQVar15;
  pointer ppVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  QTableWidgetItem **ppQVar20;
  long size;
  ulong uVar21;
  code *__comp;
  ulong uVar22;
  long lVar23;
  long in_FS_OFFSET;
  QTableWidgetItem *itm;
  int local_170;
  long local_148;
  ulong local_140;
  QArrayDataPointer<QPersistentModelIndex> local_118;
  QArrayDataPointer<QTableWidgetItem_*> local_f8;
  QArrayDataPointer<QTableWidgetItem_*> local_d8;
  QArrayDataPointer<QTableWidgetItem_*> local_b8;
  QModelIndexList local_98;
  QList<std::pair<QTableWidgetItem_*,_int>_> local_78;
  _Temporary_buffer<QList<std::pair<QTableWidgetItem_*,_int>_>::iterator,_std::pair<QTableWidgetItem_*,_int>_>
  local_58;
  iterator local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (pair<QTableWidgetItem_*,_int> *)0x0;
  local_78.d.size = 0;
  QList<std::pair<QTableWidgetItem_*,_int>_>::reserve(&local_78,(long)((end - start) + 1));
  local_98.d.d._0_4_ = start;
  if (start <= end) {
    local_98.d.d._0_4_ = start;
    do {
      local_58._M_original_len =
           (size_type_conflict1)QTableModel::item(this,(int)local_98.d.d,column);
      if ((QTableWidgetItem *)local_58._M_original_len == (QTableWidgetItem *)0x0) break;
      QtPrivate::QPodArrayOps<std::pair<QTableWidgetItem*,int>>::emplace<QTableWidgetItem*&,int&>
                ((QPodArrayOps<std::pair<QTableWidgetItem*,int>> *)&local_78,local_78.d.size,
                 (QTableWidgetItem **)&local_58,(int *)&local_98);
      QList<std::pair<QTableWidgetItem_*,_int>_>::end(&local_78);
      iVar3 = (int)local_98.d.d + 1;
      bVar6 = (int)local_98.d.d < end;
      local_98.d.d._0_4_ = iVar3;
    } while (bVar6);
  }
  __comp = itemGreaterThan;
  if (order == AscendingOrder) {
    __comp = itemLessThan;
  }
  __seed = QList<std::pair<QTableWidgetItem_*,_int>_>::begin(&local_78);
  __last = QList<std::pair<QTableWidgetItem_*,_int>_>::end(&local_78);
  if (__seed.i != __last.i) {
    lVar11 = (long)__last.i - (long)__seed.i >> 4;
    local_58._M_buffer = (pointer)&DAT_aaaaaaaaaaaaaaaa;
    local_58._M_original_len = (size_type_conflict1)&DAT_aaaaaaaaaaaaaaaa;
    local_58._M_len = (size_type_conflict1)&DAT_aaaaaaaaaaaaaaaa;
    std::
    _Temporary_buffer<QList<std::pair<QTableWidgetItem_*,_int>_>::iterator,_std::pair<QTableWidgetItem_*,_int>_>
    ::_Temporary_buffer(&local_58,__seed,(lVar11 - (lVar11 + 1 >> 0x3f)) + 1 >> 1);
    if (local_58._M_buffer == (pair<QTableWidgetItem_*,_int> *)0x0) {
      std::
      __inplace_stable_sort<QList<std::pair<QTableWidgetItem*,int>>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<QTableWidgetItem*,int>const&,std::pair<QTableWidgetItem*,int>const&)>>
                (__seed,__last,
                 (_Iter_comp_iter<bool_(*)(const_std::pair<QTableWidgetItem_*,_int>_&,_const_std::pair<QTableWidgetItem_*,_int>_&)>
                  )__comp);
    }
    else {
      std::
      __stable_sort_adaptive<QList<std::pair<QTableWidgetItem*,int>>::iterator,std::pair<QTableWidgetItem*,int>*,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<QTableWidgetItem*,int>const&,std::pair<QTableWidgetItem*,int>const&)>>
                (__seed,__last,local_58._M_buffer,local_58._M_len,
                 (_Iter_comp_iter<bool_(*)(const_std::pair<QTableWidgetItem_*,_int>_&,_const_std::pair<QTableWidgetItem_*,_int>_&)>
                  )__comp);
    }
    operator_delete(local_58._M_buffer,local_58._M_len << 4);
  }
  local_58._M_original_len = 0;
  local_58._M_len = 0;
  local_58._M_buffer = (pointer)0x0;
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (QModelIndex *)0x0;
  local_98.d.size = 0;
  local_b8.d = (this->tableItems).d.d;
  local_b8.ptr = (this->tableItems).d.ptr;
  local_b8.size = (this->tableItems).d.size;
  if (&(local_b8.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_b8.d)->super_QArrayData).ref_)->ref_)._q_value.super___atomic_base<int>
    ._M_i = (((QArrayData *)&((local_b8.d)->super_QArrayData).ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_d8.d = (this->verticalHeaderItems).d.d;
  local_d8.ptr = (this->verticalHeaderItems).d.ptr;
  local_d8.size = (this->verticalHeaderItems).d.size;
  if (&(local_d8.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_d8.d)->super_QArrayData).ref_)->ref_)._q_value.super___atomic_base<int>
    ._M_i = (((QArrayData *)&((local_d8.d)->super_QArrayData).ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_f8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.ptr = (QTableWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
  columnItems((QList<QTableWidgetItem_*> *)&local_f8,this,column);
  iVar12 = QList<QTableWidgetItem_*>::begin((QList<QTableWidgetItem_*> *)&local_f8);
  if (local_78.d.size != 0) {
    local_140 = 1;
    local_148 = 0x18;
    uVar22 = 0;
    bVar6 = false;
    do {
      iVar13 = QList<QTableWidgetItem_*>::begin((QList<QTableWidgetItem_*> *)&local_f8);
      iVar3 = local_78.d.ptr[uVar22].second;
      lVar11 = (long)iVar3;
      item = local_f8.ptr[lVar11];
      if ((&(local_f8.d)->super_QArrayData == (QArrayData *)0x0) ||
         (1 < ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QArrayDataPointer<QTableWidgetItem_*>::reallocateAndGrow
                  (&local_f8,GrowsAtEnd,0,(QArrayDataPointer<QTableWidgetItem_*> *)0x0);
      }
      ppQVar20 = local_f8.ptr + lVar11 + 1;
      ppQVar1 = local_f8.ptr + local_f8.size;
      if (((iVar3 != 0) || (ppQVar9 = ppQVar20, ppQVar20 == ppQVar1)) &&
         (ppQVar9 = local_f8.ptr, ppQVar20 != ppQVar1)) {
        memmove(local_f8.ptr + lVar11,ppQVar20,(long)ppQVar1 - (long)ppQVar20);
        ppQVar9 = local_f8.ptr;
      }
      local_f8.ptr = ppQVar9;
      local_f8.size = local_f8.size + -1;
      iVar14 = QList<QTableWidgetItem_*>::begin((QList<QTableWidgetItem_*> *)&local_f8);
      local_118.d = (Data *)((long)iVar14.i + ((long)iVar12.i - (long)iVar13.i));
      local_40 = QList<QTableWidgetItem_*>::end((QList<QTableWidgetItem_*> *)&local_f8);
      iVar12 = sortedInsertionIterator((iterator *)&local_118,&local_40,order,item);
      iVar13 = QList<QTableWidgetItem_*>::begin((QList<QTableWidgetItem_*> *)&local_f8);
      local_170 = (int)((ulong)((long)iVar12.i - (long)iVar13.i) >> 3);
      if (local_170 < 1) {
        local_170 = 0;
      }
      if (((local_170 < iVar3) &&
          (iVar10 = (*item->_vptr_QTableWidgetItem[5])(item,local_f8.ptr[lVar11 + -1]),
          (char)iVar10 == '\0')) &&
         (iVar10 = (*local_f8.ptr[lVar11 + -1]->_vptr_QTableWidgetItem[5])
                             (local_f8.ptr[lVar11 + -1],item), (char)iVar10 == '\0')) {
        local_170 = iVar3;
      }
      lVar18 = (long)iVar12.i - (long)local_f8.ptr;
      QtPrivate::QPodArrayOps<QTableWidgetItem_*>::insert
                ((QPodArrayOps<QTableWidgetItem_*> *)&local_f8,lVar18 >> 3,1,item);
      iVar12 = QList<QTableWidgetItem_*>::begin((QList<QTableWidgetItem_*> *)&local_f8);
      if (local_170 != iVar3) {
        if (!bVar6) {
          local_118.d = (Data *)0x0;
          local_118.ptr = (QPersistentModelIndex *)0x0;
          local_118.size = 0;
          QAbstractItemModel::layoutAboutToBeChanged
                    ((QList_conflict *)this,(LayoutChangeHint)&local_118);
          QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&local_118);
          QAbstractItemModel::persistentIndexList();
          sVar8 = local_58._M_original_len;
          local_58._M_buffer = (pointer)local_118.size;
          local_58._M_len = (size_type_conflict1)local_118.ptr;
          local_58._M_original_len = (size_type_conflict1)local_118.d;
          local_118.size = 0;
          local_118.d = (Data *)0x0;
          local_118.ptr = (QPersistentModelIndex *)0x0;
          if ((QArrayData *)sVar8 != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)sVar8)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)sVar8)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)sVar8)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)sVar8,0x18,0x10);
            }
          }
          if (&(local_118.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_118.d)->super_QArrayData,0x18,0x10);
            }
          }
          pDVar7 = local_98.d.d;
          if ((QArrayData *)local_58._M_original_len != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_58._M_original_len)->_q_value).super___atomic_base<int>._M_i
                 = (((QBasicAtomicInt *)local_58._M_original_len)->_q_value).
                   super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_98.d.d = (Data *)local_58._M_original_len;
          local_98.d.ptr = (QModelIndex *)local_58._M_len;
          local_98.d.size = (qsizetype)local_58._M_buffer;
          bVar6 = true;
          if (&pDVar7->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar7->super_QArrayData,0x18,0x10);
            }
          }
        }
        local_118.d = (Data *)0xffffffffffffffff;
        local_118.ptr = (QPersistentModelIndex *)0x0;
        local_118.size = 0;
        iVar10 = (**(code **)(*(long *)this + 0x80))(this,&local_118);
        size = (long)iVar10;
        local_118.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_118.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_118.ptr = (QPersistentModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
        QList<QTableWidgetItem_*>::QList((QList<QTableWidgetItem_*> *)&local_118,size);
        if (0 < iVar10) {
          lVar23 = 0;
          do {
            pQVar4 = local_b8.ptr[(this->horizontalHeaderItems).d.size * lVar11 + lVar23];
            ppQVar15 = QList<QTableWidgetItem_*>::data((QList<QTableWidgetItem_*> *)&local_118);
            ppQVar15[lVar23] = pQVar4;
            lVar23 = lVar23 + 1;
          } while (size != lVar23);
        }
        if (iVar10 != 0) {
          lVar23 = (this->horizontalHeaderItems).d.size * lVar11;
          if ((&(local_b8.d)->super_QArrayData == (QArrayData *)0x0) ||
             (1 < ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QArrayDataPointer<QTableWidgetItem_*>::reallocateAndGrow
                      (&local_b8,GrowsAtEnd,0,(QArrayDataPointer<QTableWidgetItem_*> *)0x0);
          }
          ppQVar1 = local_b8.ptr + lVar23 + size;
          ppQVar20 = local_b8.ptr + local_b8.size;
          if (((lVar23 != 0) || (ppQVar9 = ppQVar1, ppQVar1 == ppQVar20)) &&
             (ppQVar9 = local_b8.ptr, ppQVar1 != ppQVar20)) {
            memmove(local_b8.ptr + lVar23,ppQVar1,(long)ppQVar20 - (long)ppQVar1);
            ppQVar9 = local_b8.ptr;
          }
          local_b8.ptr = ppQVar9;
          local_b8.size = local_b8.size - size;
        }
        lVar23 = (long)local_170;
        if (iVar10 != 0) {
          QtPrivate::QPodArrayOps<QTableWidgetItem_*>::insert
                    ((QPodArrayOps<QTableWidgetItem_*> *)&local_b8,
                     (this->horizontalHeaderItems).d.size * lVar23,size,(parameter_type)0x0);
        }
        QList<QTableWidgetItem_*>::begin((QList<QTableWidgetItem_*> *)&local_b8);
        if (0 < iVar10) {
          lVar19 = 0;
          do {
            pQVar4 = (QTableWidgetItem *)local_118.ptr[lVar19].d;
            lVar5 = (this->horizontalHeaderItems).d.size;
            ppQVar15 = QList<QTableWidgetItem_*>::data((QList<QTableWidgetItem_*> *)&local_b8);
            ppQVar15[lVar5 * lVar23 + lVar19] = pQVar4;
            lVar19 = lVar19 + 1;
          } while (size != lVar19);
        }
        pQVar4 = local_d8.ptr[lVar11];
        if ((&(local_d8.d)->super_QArrayData == (QArrayData *)0x0) ||
           (1 < ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QArrayDataPointer<QTableWidgetItem_*>::reallocateAndGrow
                    (&local_d8,GrowsAtEnd,0,(QArrayDataPointer<QTableWidgetItem_*> *)0x0);
        }
        ppQVar20 = local_d8.ptr + lVar11 + 1;
        ppQVar1 = local_d8.ptr + local_d8.size;
        if (((iVar3 != 0) || (ppQVar9 = ppQVar20, ppQVar20 == ppQVar1)) &&
           (ppQVar9 = local_d8.ptr, ppQVar20 != ppQVar1)) {
          memmove(local_d8.ptr + lVar11,ppQVar20,(long)ppQVar1 - (long)ppQVar20);
          ppQVar9 = local_d8.ptr;
        }
        local_d8.ptr = ppQVar9;
        local_d8.size = local_d8.size + -1;
        local_40.i = (QTableWidgetItem **)pQVar4;
        QtPrivate::QPodArrayOps<QTableWidgetItem*>::emplace<QTableWidgetItem*&>
                  ((QPodArrayOps<QTableWidgetItem*> *)&local_d8,lVar23,
                   (QTableWidgetItem **)&local_40);
        QList<QTableWidgetItem_*>::begin((QList<QTableWidgetItem_*> *)&local_d8);
        updateRowIndexes(this,&local_98,iVar3,local_170);
        uVar21 = local_140;
        lVar11 = local_148;
        if (uVar22 + 1 < (ulong)local_78.d.size) {
          do {
            iVar10 = *(int *)((long)&(local_78.d.ptr)->first + lVar11);
            if (((iVar3 < iVar10) && (iVar17 = -1, iVar10 <= local_170)) ||
               ((iVar10 < iVar3 && (iVar17 = 1, local_170 <= iVar10)))) {
              ppVar16 = QList<std::pair<QTableWidgetItem_*,_int>_>::data(&local_78);
              piVar2 = (int *)((long)&ppVar16->first + lVar11);
              *piVar2 = *piVar2 + iVar17;
            }
            uVar21 = uVar21 + 1;
            lVar11 = lVar11 + 0x10;
          } while (uVar21 < (ulong)local_78.d.size);
        }
        if (&(local_118.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_118.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_118.d)->super_QArrayData,8,0x10);
          }
        }
      }
      iVar12.i = iVar12.i + lVar18;
      uVar22 = uVar22 + 1;
      local_140 = local_140 + 1;
      local_148 = local_148 + 0x10;
    } while (uVar22 < (ulong)local_78.d.size);
    if (bVar6) {
      QArrayDataPointer<QTableWidgetItem_*>::operator=(&(this->tableItems).d,&local_b8);
      QArrayDataPointer<QTableWidgetItem_*>::operator=(&(this->verticalHeaderItems).d,&local_d8);
      QAbstractItemModel::changePersistentIndexList
                ((QList_conflict *)this,(QList_conflict *)&local_58);
      local_118.d = (Data *)0x0;
      local_118.ptr = (QPersistentModelIndex *)0x0;
      local_118.size = 0;
      QAbstractItemModel::layoutChanged((QList_conflict *)this,(LayoutChangeHint)&local_118);
      QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&local_118);
    }
  }
  if (&(local_f8.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d)->super_QArrayData,8,0x10);
    }
  }
  if (&(local_d8.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d)->super_QArrayData,8,0x10);
    }
  }
  if (&(local_b8.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d)->super_QArrayData,8,0x10);
    }
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,0x18,0x10);
    }
  }
  if ((QArrayData *)local_58._M_original_len != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_58._M_original_len)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_58._M_original_len)->_q_value).super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_58._M_original_len)->_q_value).super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate((QArrayData *)local_58._M_original_len,0x18,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,0x10,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableModel::ensureSorted(int column, Qt::SortOrder order,
                               int start, int end)
{
    int count = end - start + 1;
    QList<std::pair<QTableWidgetItem *, int>> sorting;
    sorting.reserve(count);
    for (int row = start; row <= end; ++row) {
        QTableWidgetItem *itm = item(row, column);
        if (itm == nullptr) {
            // no more sortable items (all 0-items are
            // at the end of the table when it is sorted)
            break;
        }
        sorting.emplace_back(itm, row);
    }

    const auto compare = (order == Qt::AscendingOrder ? &itemLessThan : &itemGreaterThan);
    std::stable_sort(sorting.begin(), sorting.end(), compare);
    QModelIndexList oldPersistentIndexes, newPersistentIndexes;
    QList<QTableWidgetItem *> newTable = tableItems;
    QList<QTableWidgetItem *> newVertical = verticalHeaderItems;
    QList<QTableWidgetItem *> colItems = columnItems(column);
    QList<QTableWidgetItem *>::iterator vit = colItems.begin();
    qsizetype distanceFromBegin = 0;
    bool changed = false;
    for (int i = 0; i < sorting.size(); ++i) {
        distanceFromBegin = std::distance(colItems.begin(), vit);
        int oldRow = sorting.at(i).second;
        QTableWidgetItem *item = colItems.at(oldRow);
        colItems.remove(oldRow);
        vit = sortedInsertionIterator(colItems.begin() + distanceFromBegin, colItems.end(), order,
                                      item);
        int newRow = qMax((int)(vit - colItems.begin()), 0);
        if ((newRow < oldRow) && !(*item < *colItems.at(oldRow - 1)) && !(*colItems.at(oldRow - 1) < *item))
            newRow = oldRow;
        vit = colItems.insert(vit, item);
        if (newRow != oldRow) {
            if (!changed) {
                emit layoutAboutToBeChanged({}, QAbstractItemModel::VerticalSortHint);
                oldPersistentIndexes = persistentIndexList();
                newPersistentIndexes = oldPersistentIndexes;
                changed = true;
            }
            // move the items @ oldRow to newRow
            int cc = columnCount();
            QList<QTableWidgetItem *> rowItems(cc);
            for (int j = 0; j < cc; ++j)
                rowItems[j] = newTable.at(tableIndex(oldRow, j));
            newTable.remove(tableIndex(oldRow, 0), cc);
            newTable.insert(tableIndex(newRow, 0), cc, 0);
            for (int j = 0; j < cc; ++j)
                newTable[tableIndex(newRow, j)] = rowItems.at(j);
            QTableWidgetItem *header = newVertical.at(oldRow);
            newVertical.remove(oldRow);
            newVertical.insert(newRow, header);
            // update persistent indexes
            updateRowIndexes(newPersistentIndexes, oldRow, newRow);
            // the index of the remaining rows may have changed
            for (int j = i + 1; j < sorting.size(); ++j) {
                int otherRow = sorting.at(j).second;
                if (oldRow < otherRow && newRow >= otherRow)
                    --sorting[j].second;
                else if (oldRow > otherRow && newRow <= otherRow)
                    ++sorting[j].second;
            }
        }
    }

    if (changed) {
        tableItems = newTable;
        verticalHeaderItems = newVertical;
        changePersistentIndexList(oldPersistentIndexes,
                                  newPersistentIndexes);
        emit layoutChanged({}, QAbstractItemModel::VerticalSortHint);
    }
}